

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O1

vector<DevMap> *
anon_unknown.dwarf_259da0::probe_devices
          (vector<DevMap> *__return_storage_ptr__,snd_pcm_stream_t stream)

{
  _Alloc_hider _Var1;
  bool bVar2;
  uint uVar3;
  FILE *pFVar4;
  snd_pcm_stream_t sVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  long *plVar11;
  undefined8 uVar12;
  ulong *puVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  uint uVar17;
  char cVar18;
  string spec;
  int dev;
  int card;
  string name;
  string card_prefix;
  snd_pcm_info_t *pcminfo;
  snd_ctl_t *handle;
  snd_ctl_card_info_t *info;
  string device;
  string device_prefix;
  string main_prefix;
  undefined1 local_168 [40];
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  uint local_128;
  uint local_124;
  ulong *local_120;
  _Alloc_hider local_118;
  ulong local_110;
  ulong uStack_108;
  ulong local_100;
  _Alloc_hider local_f8;
  ulong local_f0;
  ulong local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_e0;
  vector<DevMap> *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  snd_pcm_stream_t local_bc;
  undefined8 local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  ulong local_88;
  ulong local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_78;
  _GLOBAL__N_1 *local_70;
  long local_68;
  char *local_60;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = __return_storage_ptr__;
  (*(anonymous_namespace)::psnd_ctl_card_info_malloc)(&local_b8);
  (*(anonymous_namespace)::psnd_pcm_info_malloc)(&local_d0);
  local_168._0_8_ = local_168 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"ALSA Default","");
  pcVar15 = "capture";
  if (stream == SND_PCM_STREAM_PLAYBACK) {
    pcVar15 = "device";
  }
  pcVar15 = GetConfigValue((char *)0x0,"alsa",pcVar15,"default");
  std::__cxx11::string::string((string *)(local_168 + 0x20),pcVar15,(allocator *)&local_50);
  std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
  emplace_back<(anonymous_namespace)::DevMap>(local_d8,(DevMap *)local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._32_8_ != &local_138) {
    operator_delete((void *)local_168._32_8_,local_138._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
  }
  pcVar15 = "custom-captures";
  if (stream == SND_PCM_STREAM_PLAYBACK) {
    pcVar15 = "custom-devices";
  }
  local_bc = stream;
  pcVar15 = GetConfigValue((char *)0x0,"alsa",pcVar15,(char *)(AlsaPlayback::reset::channellist + 4)
                          );
  local_70 = (_GLOBAL__N_1 *)
             &(local_d8->
              super__Vector_base<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar2 = true;
    if (pcVar15 == (char *)0x0) {
      pcVar15 = (char *)0x0;
    }
    else if (*pcVar15 != '\0') {
      pcVar8 = strchr(pcVar15,0x3b);
      pcVar9 = strchr(pcVar15,0x3d);
      if (pcVar9 == (char *)0x0) {
        puVar13 = (ulong *)(local_168 + 0x10);
        local_168._0_8_ = puVar13;
        if (pcVar8 == (char *)0x0) {
          sVar10 = strlen(pcVar15);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_168,pcVar15,pcVar15 + sVar10);
          pcVar15 = (char *)0x0;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_168,pcVar15,pcVar8);
          pcVar15 = pcVar8 + 1;
        }
        if (0 < (int)gLogLevel) {
          _GLOBAL__N_1::probe_devices((_GLOBAL__N_1 *)local_168);
        }
        if ((ulong *)local_168._0_8_ != puVar13) {
          operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
        }
      }
      else {
        local_168._0_8_ = local_168 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_168,pcVar15,pcVar9);
        pcVar9 = pcVar9 + 1;
        local_168._32_8_ = &local_138;
        if (pcVar8 == (char *)0x0) {
          sVar10 = strlen(pcVar9);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_168 + 0x20),pcVar9,pcVar9 + sVar10);
          pcVar15 = (char *)0x0;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_168 + 0x20),pcVar9,pcVar8);
          pcVar15 = pcVar8 + 1;
        }
        std::
        vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
        emplace_back<(anonymous_namespace)::DevMap>(local_d8,(DevMap *)local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._32_8_ != &local_138) {
          operator_delete((void *)local_168._32_8_,local_138._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
          operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
        }
        if (2 < (int)gLogLevel) {
          _GLOBAL__N_1::probe_devices(local_70);
        }
      }
      bVar2 = false;
    }
    sVar5 = local_bc;
  } while (!bVar2);
  if (SND_PCM_STREAM_CAPTURE < local_bc) {
    __assert_fail("stream == SND_PCM_STREAM_PLAYBACK || stream == SND_PCM_STREAM_CAPTURE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rbetik12[P]FallingSand/lib/vx-sound/lib/openal/alc/backends/alsa.cpp"
                  ,0xfd,"const char *(anonymous namespace)::prefix_name(snd_pcm_stream_t)");
  }
  local_60 = "capture-prefix";
  if (local_bc == SND_PCM_STREAM_PLAYBACK) {
    local_60 = "device-prefix";
  }
  ConfigValueStr_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_168,(char *)0x0,"alsa",local_60);
  al::optional<std::__cxx11::string>::value_or<char_const(&)[8]>
            (&local_50,local_168,(char (*) [8])"plughw:");
  if ((local_168[0] == (_GLOBAL__N_1)0x1) && ((undefined1 *)local_168._8_8_ != local_168 + 0x18)) {
    operator_delete((void *)local_168._8_8_,local_168._24_8_ + 1);
  }
  local_124 = 0xffffffff;
  iVar6 = (*(anonymous_namespace)::psnd_card_next)();
  local_68 = 0xe - (ulong)(sVar5 == SND_PCM_STREAM_PLAYBACK);
  do {
    uVar3 = local_124;
    pFVar4 = gLogFile;
    if ((iVar6 < 0) || ((int)local_124 < 0)) {
      if ((iVar6 < 0) && (0 < (int)gLogLevel)) {
        uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
        fprintf((FILE *)pFVar4,"[ALSOFT] (EE) snd_card_next failed: %s\n",uVar12);
      }
      (*(anonymous_namespace)::psnd_pcm_info_free)(local_d0);
      (*(anonymous_namespace)::psnd_ctl_card_info_free)(local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return local_d8;
    }
    uVar16 = 1;
    if (9 < local_124) {
      uVar17 = local_124;
      uVar7 = 4;
      do {
        uVar16 = uVar7;
        if (uVar17 < 100) {
          uVar16 = uVar16 - 2;
          goto LAB_001612bd;
        }
        if (uVar17 < 1000) {
          uVar16 = uVar16 - 1;
          goto LAB_001612bd;
        }
        if (uVar17 < 10000) goto LAB_001612bd;
        bVar2 = 99999 < uVar17;
        uVar17 = uVar17 / 10000;
        uVar7 = uVar16 + 4;
      } while (bVar2);
      uVar16 = uVar16 + 1;
    }
LAB_001612bd:
    local_168._0_8_ = local_168 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_168,(char)uVar16);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_168._0_8_,uVar16,uVar3);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0x193476);
    local_120 = &local_110;
    puVar13 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar13) {
      local_110 = *puVar13;
      uStack_108 = plVar11[3];
    }
    else {
      local_110 = *puVar13;
      local_120 = (ulong *)*plVar11;
    }
    local_118._M_p = (pointer)plVar11[1];
    *plVar11 = (long)puVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    iVar6 = (*(anonymous_namespace)::psnd_ctl_open)(&local_c8,local_120,0);
    pFVar4 = gLogFile;
    if (iVar6 < 0) {
      if (0 < (int)gLogLevel) {
        local_100 = CONCAT44(local_100._4_4_,local_124);
        uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
        fprintf((FILE *)pFVar4,"[ALSOFT] (EE) control open (hw:%d): %s\n",local_100 & 0xffffffff,
                uVar12);
      }
    }
    else {
      iVar6 = (*(anonymous_namespace)::psnd_ctl_card_info)(local_c8);
      pFVar4 = gLogFile;
      if (iVar6 < 0) {
        if (0 < (int)gLogLevel) {
          local_100 = CONCAT44(local_100._4_4_,local_124);
          uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
          fprintf((FILE *)pFVar4,"[ALSOFT] (EE) control hardware info (hw:%d): %s\n",
                  local_100 & 0xffffffff,uVar12);
        }
        (*(anonymous_namespace)::psnd_ctl_close)(local_c8);
      }
      else {
        local_58 = (char *)(*(anonymous_namespace)::psnd_ctl_card_info_get_name)(local_b8);
        local_100 = (*(anonymous_namespace)::psnd_ctl_card_info_get_id)(local_b8);
        std::__cxx11::string::_M_replace((ulong)&local_120,0,local_118._M_p,(ulong)local_60);
        cVar18 = (char)&local_120;
        std::__cxx11::string::push_back(cVar18);
        std::__cxx11::string::append((char *)&local_120);
        ConfigValueStr_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_168,(char *)0x0,"alsa",(char *)local_120);
        local_f8._M_p = (pointer)&local_e8;
        if (local_168[0] == (_GLOBAL__N_1)0x1) {
          if ((undefined1 *)local_168._8_8_ == local_168 + 0x18) {
            paStack_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_168._32_8_;
          }
          else {
            local_f8._M_p = (pointer)local_168._8_8_;
          }
          local_e8 = local_168._24_8_;
          local_f0 = local_168._16_8_;
          local_168._16_8_ = 0;
          local_168._24_8_ = local_168._24_8_ & 0xffffffffffffff00;
          local_168._8_8_ = local_168 + 0x18;
        }
        else {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_50._M_dataplus._M_p,
                     local_50._M_dataplus._M_p + local_50._M_string_length);
        }
        if ((local_168[0] == (_GLOBAL__N_1)0x1) &&
           ((undefined1 *)local_168._8_8_ != local_168 + 0x18)) {
          operator_delete((void *)local_168._8_8_,local_168._24_8_ + 1);
        }
        local_128 = 0xffffffff;
        while( true ) {
          iVar6 = (*(anonymous_namespace)::psnd_ctl_pcm_next_device)(local_c8,&local_128);
          if ((iVar6 < 0) && (0 < (int)gLogLevel)) {
            _GLOBAL__N_1::probe_devices();
          }
          if ((int)local_128 < 0) break;
          (*(anonymous_namespace)::psnd_pcm_info_set_device)(local_d0);
          (*(anonymous_namespace)::psnd_pcm_info_set_subdevice)(local_d0,0);
          (*(anonymous_namespace)::psnd_pcm_info_set_stream)(local_d0,local_bc);
          iVar6 = (*(anonymous_namespace)::psnd_ctl_pcm_info)(local_c8);
          uVar3 = local_124;
          pFVar4 = gLogFile;
          if (iVar6 < 0) {
            if ((iVar6 != -2) && (0 < (int)gLogLevel)) {
              uVar12 = (*(anonymous_namespace)::psnd_strerror)(iVar6);
              fprintf((FILE *)pFVar4,"[ALSOFT] (EE) control digital audio info (hw:%d): %s\n",
                      (ulong)uVar3,uVar12);
            }
          }
          else {
            std::__cxx11::string::_M_replace((ulong)&local_120,0,local_118._M_p,(ulong)local_60);
            std::__cxx11::string::push_back(cVar18);
            std::__cxx11::string::append((char *)&local_120);
            std::__cxx11::string::push_back(cVar18);
            uVar3 = -local_128;
            if (0 < (int)local_128) {
              uVar3 = local_128;
            }
            uVar16 = 1;
            if (9 < uVar3) {
              uVar14 = (ulong)uVar3;
              uVar17 = 4;
              do {
                uVar16 = uVar17;
                uVar7 = (uint)uVar14;
                if (uVar7 < 100) {
                  uVar16 = uVar16 - 2;
                  goto LAB_0016169a;
                }
                if (uVar7 < 1000) {
                  uVar16 = uVar16 - 1;
                  goto LAB_0016169a;
                }
                if (uVar7 < 10000) goto LAB_0016169a;
                uVar14 = uVar14 / 10000;
                uVar17 = uVar16 + 4;
              } while (99999 < uVar7);
              uVar16 = uVar16 + 1;
            }
LAB_0016169a:
            uVar17 = local_128 >> 0x1f;
            local_168._0_8_ = local_168 + 0x10;
            std::__cxx11::string::_M_construct
                      ((ulong)local_168,(char)uVar16 - (char)((int)local_128 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(local_168._0_8_ + (ulong)uVar17),uVar16,uVar3);
            std::__cxx11::string::_M_append((char *)&local_120,local_168._0_8_);
            if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
              operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
            }
            ConfigValueStr_abi_cxx11_
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_168,(char *)0x0,"alsa",(char *)local_120);
            _Var1._M_p = local_168 + 0x18;
            if (local_168[0] == (_GLOBAL__N_1)0x1) {
              local_90._M_p = (pointer)&local_80;
              if ((pointer)local_168._8_8_ == _Var1._M_p) {
                paStack_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)local_168._32_8_;
              }
              else {
                local_90._M_p = (pointer)local_168._8_8_;
              }
              local_80 = local_168._24_8_;
              local_88 = local_168._16_8_;
              local_168._16_8_ = 0;
              local_168._24_8_ = local_168._24_8_ & 0xffffffffffffff00;
              local_168._8_8_ = _Var1._M_p;
            }
            else {
              local_90._M_p = (pointer)&local_80;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,local_f8._M_p,(long)local_f8._M_p + local_f0);
            }
            if ((local_168[0] == (_GLOBAL__N_1)0x1) && ((pointer)local_168._8_8_ != _Var1._M_p)) {
              operator_delete((void *)local_168._8_8_,local_168._24_8_ + 1);
            }
            pcVar15 = local_58;
            _Var1._M_p = local_118._M_p;
            strlen(local_58);
            std::__cxx11::string::_M_replace((ulong)&local_120,0,_Var1._M_p,(ulong)pcVar15);
            std::__cxx11::string::append((char *)&local_120);
            (*(anonymous_namespace)::psnd_pcm_info_get_name)(local_d0);
            std::__cxx11::string::append((char *)&local_120);
            std::__cxx11::string::append((char *)&local_120);
            std::__cxx11::string::append((char *)&local_120);
            std::__cxx11::string::append((char *)&local_120);
            uVar3 = -local_128;
            if (0 < (int)local_128) {
              uVar3 = local_128;
            }
            uVar16 = 1;
            if (9 < uVar3) {
              uVar14 = (ulong)uVar3;
              uVar17 = 4;
              do {
                uVar16 = uVar17;
                uVar7 = (uint)uVar14;
                if (uVar7 < 100) {
                  uVar16 = uVar16 - 2;
                  goto LAB_0016189d;
                }
                if (uVar7 < 1000) {
                  uVar16 = uVar16 - 1;
                  goto LAB_0016189d;
                }
                if (uVar7 < 10000) goto LAB_0016189d;
                uVar14 = uVar14 / 10000;
                uVar17 = uVar16 + 4;
              } while (99999 < uVar7);
              uVar16 = uVar16 + 1;
            }
LAB_0016189d:
            uVar17 = local_128 >> 0x1f;
            local_168._0_8_ = local_168 + 0x10;
            std::__cxx11::string::_M_construct
                      ((ulong)local_168,(char)uVar16 - (char)((int)local_128 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(local_168._0_8_ + (ulong)uVar17),uVar16,uVar3);
            std::__cxx11::string::_M_append((char *)&local_120,local_168._0_8_);
            if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
              operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
            }
            std::__cxx11::string::push_back(cVar18);
            local_b0 = &local_a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,local_90._M_p,(long)local_90._M_p + local_88);
            std::__cxx11::string::append((char *)&local_b0);
            std::__cxx11::string::append((char *)&local_b0);
            std::__cxx11::string::append((char *)&local_b0);
            uVar3 = -local_128;
            if (0 < (int)local_128) {
              uVar3 = local_128;
            }
            uVar16 = 1;
            if (9 < uVar3) {
              uVar14 = (ulong)uVar3;
              uVar17 = 4;
              do {
                uVar16 = uVar17;
                uVar7 = (uint)uVar14;
                if (uVar7 < 100) {
                  uVar16 = uVar16 - 2;
                  goto LAB_001619c5;
                }
                if (uVar7 < 1000) {
                  uVar16 = uVar16 - 1;
                  goto LAB_001619c5;
                }
                if (uVar7 < 10000) goto LAB_001619c5;
                uVar14 = uVar14 / 10000;
                uVar17 = uVar16 + 4;
              } while (99999 < uVar7);
              uVar16 = uVar16 + 1;
            }
LAB_001619c5:
            uVar17 = local_128 >> 0x1f;
            local_168._0_8_ = local_168 + 0x10;
            std::__cxx11::string::_M_construct
                      ((ulong)local_168,(char)uVar16 - (char)((int)local_128 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(local_168._0_8_ + (ulong)uVar17),uVar16,uVar3);
            std::__cxx11::string::_M_append((char *)&local_b0,local_168._0_8_);
            puVar13 = (ulong *)(local_168 + 0x10);
            if ((ulong *)local_168._0_8_ != puVar13) {
              operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
            }
            if (local_120 == &local_110) {
              local_168._24_8_ = uStack_108;
              local_168._0_8_ = puVar13;
            }
            else {
              local_168._0_8_ = local_120;
            }
            local_168._16_8_ = local_110;
            local_168._8_8_ = local_118._M_p;
            local_118._M_p = (pointer)0x0;
            local_110 = local_110 & 0xffffffffffffff00;
            if (local_b0 == &local_a0) {
              local_138._8_8_ = local_a0._8_8_;
              local_168._32_8_ = &local_138;
            }
            else {
              local_168._32_8_ = local_b0;
            }
            local_138._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
            local_138._M_local_buf[0] = local_a0._M_local_buf[0];
            local_140 = local_a8;
            local_a8 = 0;
            local_a0._M_local_buf[0] = '\0';
            local_120 = &local_110;
            local_b0 = &local_a0;
            std::
            vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
            ::emplace_back<(anonymous_namespace)::DevMap>(local_d8,(DevMap *)local_168);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._32_8_ != &local_138) {
              operator_delete((void *)local_168._32_8_,local_138._M_allocated_capacity + 1);
            }
            if ((ulong *)local_168._0_8_ != puVar13) {
              operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
            }
            if (2 < (int)gLogLevel) {
              _GLOBAL__N_1::probe_devices(local_70);
            }
            if (local_b0 != &local_a0) {
              operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,
                                                local_a0._M_local_buf[0]) + 1);
            }
            if ((ulong *)local_90._M_p != &local_80) {
              operator_delete(local_90._M_p,local_80 + 1);
            }
          }
        }
        (*(anonymous_namespace)::psnd_ctl_close)(local_c8);
        if ((ulong *)local_f8._M_p != &local_e8) {
          operator_delete(local_f8._M_p,local_e8 + 1);
        }
      }
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    iVar6 = (*(anonymous_namespace)::psnd_card_next)(&local_124);
  } while( true );
}

Assistant:

al::vector<DevMap> probe_devices(snd_pcm_stream_t stream)
{
    al::vector<DevMap> devlist;

    snd_ctl_card_info_t *info;
    snd_ctl_card_info_malloc(&info);
    snd_pcm_info_t *pcminfo;
    snd_pcm_info_malloc(&pcminfo);

    devlist.emplace_back(DevMap{alsaDevice,
        GetConfigValue(nullptr, "alsa", (stream==SND_PCM_STREAM_PLAYBACK) ? "device" : "capture",
            "default")});

    const char *customdevs{GetConfigValue(nullptr, "alsa",
        (stream == SND_PCM_STREAM_PLAYBACK) ? "custom-devices" : "custom-captures", "")};
    while(const char *curdev{customdevs})
    {
        if(!curdev[0]) break;
        customdevs = strchr(curdev, ';');
        const char *sep{strchr(curdev, '=')};
        if(!sep)
        {
            std::string spec{customdevs ? std::string(curdev, customdevs++) : std::string(curdev)};
            ERR("Invalid ALSA device specification \"%s\"\n", spec.c_str());
            continue;
        }

        const char *oldsep{sep++};
        devlist.emplace_back(DevMap{std::string(curdev, oldsep),
            customdevs ? std::string(sep, customdevs++) : std::string(sep)});
        const auto &entry = devlist.back();
        TRACE("Got device \"%s\", \"%s\"\n", entry.name.c_str(), entry.device_name.c_str());
    }

    const std::string main_prefix{
        ConfigValueStr(nullptr, "alsa", prefix_name(stream)).value_or("plughw:")};

    int card{-1};
    int err{snd_card_next(&card)};
    for(;err >= 0 && card >= 0;err = snd_card_next(&card))
    {
        std::string name{"hw:" + std::to_string(card)};

        snd_ctl_t *handle;
        if((err=snd_ctl_open(&handle, name.c_str(), 0)) < 0)
        {
            ERR("control open (hw:%d): %s\n", card, snd_strerror(err));
            continue;
        }
        if((err=snd_ctl_card_info(handle, info)) < 0)
        {
            ERR("control hardware info (hw:%d): %s\n", card, snd_strerror(err));
            snd_ctl_close(handle);
            continue;
        }

        const char *cardname{snd_ctl_card_info_get_name(info)};
        const char *cardid{snd_ctl_card_info_get_id(info)};
        name = prefix_name(stream);
        name += '-';
        name += cardid;
        const std::string card_prefix{
            ConfigValueStr(nullptr, "alsa", name.c_str()).value_or(main_prefix)};

        int dev{-1};
        while(1)
        {
            if(snd_ctl_pcm_next_device(handle, &dev) < 0)
                ERR("snd_ctl_pcm_next_device failed\n");
            if(dev < 0) break;

            snd_pcm_info_set_device(pcminfo, static_cast<ALuint>(dev));
            snd_pcm_info_set_subdevice(pcminfo, 0);
            snd_pcm_info_set_stream(pcminfo, stream);
            if((err=snd_ctl_pcm_info(handle, pcminfo)) < 0)
            {
                if(err != -ENOENT)
                    ERR("control digital audio info (hw:%d): %s\n", card, snd_strerror(err));
                continue;
            }

            /* "prefix-cardid-dev" */
            name = prefix_name(stream);
            name += '-';
            name += cardid;
            name += '-';
            name += std::to_string(dev);
            const std::string device_prefix{
                ConfigValueStr(nullptr, "alsa", name.c_str()).value_or(card_prefix)};

            /* "CardName, PcmName (CARD=cardid,DEV=dev)" */
            name = cardname;
            name += ", ";
            name += snd_pcm_info_get_name(pcminfo);
            name += " (CARD=";
            name += cardid;
            name += ",DEV=";
            name += std::to_string(dev);
            name += ')';

            /* "devprefixCARD=cardid,DEV=dev" */
            std::string device{device_prefix};
            device += "CARD=";
            device += cardid;
            device += ",DEV=";
            device += std::to_string(dev);
            
            devlist.emplace_back(DevMap{std::move(name), std::move(device)});
            const auto &entry = devlist.back();
            TRACE("Got device \"%s\", \"%s\"\n", entry.name.c_str(), entry.device_name.c_str());
        }
        snd_ctl_close(handle);
    }
    if(err < 0)
        ERR("snd_card_next failed: %s\n", snd_strerror(err));

    snd_pcm_info_free(pcminfo);
    snd_ctl_card_info_free(info);

    return devlist;
}